

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderLocatorLineNumber(xmlTextReaderLocatorPtr locator)

{
  long lVar1;
  long local_30;
  xmlParserInputPtr input;
  int ret;
  xmlParserCtxtPtr ctx;
  xmlTextReaderLocatorPtr locator_local;
  
  if (locator == (xmlTextReaderLocatorPtr)0x0) {
    locator_local._4_4_ = -1;
  }
  else {
    if (*(long *)((long)locator + 0x50) == 0) {
      local_30 = *(long *)((long)locator + 0x38);
      if ((*(long *)(local_30 + 8) == 0) && (1 < *(int *)((long)locator + 0x40))) {
        local_30 = *(long *)(*(long *)((long)locator + 0x48) +
                            (long)(*(int *)((long)locator + 0x40) + -2) * 8);
      }
      if (local_30 == 0) {
        input._4_4_ = -1;
      }
      else {
        input._4_4_ = *(int *)(local_30 + 0x34);
      }
    }
    else {
      lVar1 = xmlGetLineNo(*(xmlNode **)((long)locator + 0x50));
      input._4_4_ = (int)lVar1;
    }
    locator_local._4_4_ = input._4_4_;
  }
  return locator_local._4_4_;
}

Assistant:

int
xmlTextReaderLocatorLineNumber(xmlTextReaderLocatorPtr locator) {
    /* we know that locator is a xmlParserCtxtPtr */
    xmlParserCtxtPtr ctx = (xmlParserCtxtPtr)locator;
    int ret = -1;

    if (locator == NULL)
        return(-1);
    if (ctx->node != NULL) {
	ret = xmlGetLineNo(ctx->node);
    }
    else {
	/* inspired from error.c */
	xmlParserInputPtr input;
	input = ctx->input;
	if ((input->filename == NULL) && (ctx->inputNr > 1))
	    input = ctx->inputTab[ctx->inputNr - 2];
	if (input != NULL) {
	    ret = input->line;
	}
	else {
	    ret = -1;
	}
    }

    return ret;
}